

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>
wabt::MakeUnique<wabt::ArrayType>(void)

{
  ArrayType *this;
  __uniq_ptr_data<wabt::ArrayType,_std::default_delete<wabt::ArrayType>,_true,_true> in_RDI;
  string_view local_20;
  
  this = (ArrayType *)operator_new(0x78);
  string_view::string_view(&local_20);
  ArrayType::ArrayType(this,local_20);
  std::unique_ptr<wabt::ArrayType,std::default_delete<wabt::ArrayType>>::
  unique_ptr<std::default_delete<wabt::ArrayType>,void>
            ((unique_ptr<wabt::ArrayType,std::default_delete<wabt::ArrayType>> *)
             in_RDI.super___uniq_ptr_impl<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::ArrayType_*,_std::default_delete<wabt::ArrayType>_>.
             super__Head_base<0UL,_wabt::ArrayType_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::ArrayType,_std::default_delete<wabt::ArrayType>,_true,_true>)
         (tuple<wabt::ArrayType_*,_std::default_delete<wabt::ArrayType>_>)
         in_RDI.super___uniq_ptr_impl<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>._M_t.
         super__Tuple_impl<0UL,_wabt::ArrayType_*,_std::default_delete<wabt::ArrayType>_>.
         super__Head_base<0UL,_wabt::ArrayType_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}